

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMinLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar3;
  Real RVar4;
  cpp_dec_float<100U,_int,_void> cStack_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  undefined5 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&cStack_1c8,this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->thePvec->thedelta);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->theCoPvec->thedelta);
  pUVar1 = this->thePvec;
  pVVar2 = this->theLbound;
  pVVar3 = this->theUbound;
  RVar4 = Tolerances::epsilon((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_40 = 0x1000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  uStack_48 = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,RVar4);
  leavetol(&local_128,this);
  perturbMin((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&cStack_1c8,this,pUVar1,pVVar2,pVVar3,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_88,&local_128,
             ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.stat)->data,0,1);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&cStack_1c8);
  pUVar1 = this->theCoPvec;
  pVVar2 = this->theCoLbound;
  pVVar3 = this->theCoUbound;
  RVar4 = Tolerances::epsilon((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_90 = 0x1000000000;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9b = 0;
  uStack_98 = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,RVar4);
  leavetol(&local_178,this);
  perturbMin((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&cStack_1c8,this,pUVar1,pVVar2,pVVar3,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_d8,&local_178,
             ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.costat)->data,0,1);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&cStack_1c8);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&cStack_1c8,this);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMinLeave(void)
{
   SPxOut::debug(this, "DSHIFT05 iteration= {} perturbing {}", this->iteration(), shift());
   pVec().delta().setup();
   coPvec().delta().setup();
   theShift += perturbMin(pVec(), lpBound(), upBound(), epsilon(), leavetol(),
                          this->desc().status(), 0, 1);
   theShift += perturbMin(coPvec(), lcBound(), ucBound(), epsilon(), leavetol(),
                          this->desc().coStatus(), 0, 1);
   SPxOut::debug(this, "\t->{}\n", shift());
}